

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_EvNormalPartials(ON_3dVector *ds,ON_3dVector *dt,ON_3dVector *dss,ON_3dVector *dst,
                        ON_3dVector *dtt,ON_3dVector *ns,ON_3dVector *nt)

{
  double dVar1;
  double ds_o_dt_00;
  ON_3dVector local_118;
  ON_3dVector local_100;
  ON_3dVector local_e8;
  ON_3dVector local_d0;
  ON_3dVector local_b8;
  ON_3dVector local_a0;
  double local_88;
  double len3;
  double len;
  ON_3dVector V;
  double dt_o_dt;
  double ds_o_dt;
  double ds_o_ds;
  bool rc;
  ON_3dVector *ns_local;
  ON_3dVector *dtt_local;
  ON_3dVector *dst_local;
  ON_3dVector *dss_local;
  ON_3dVector *dt_local;
  ON_3dVector *ds_local;
  
  dVar1 = ON_3dVector::operator*(ds,ds);
  ds_o_dt_00 = ON_3dVector::operator*(ds,dt);
  V.z = ON_3dVector::operator*(dt,dt);
  ds_local._7_1_ = ON_EvJacobian(dVar1,ds_o_dt_00,V.z,(double *)0x0);
  if (ds_local._7_1_) {
    ON_CrossProduct((ON_3dVector *)&len,ds,dt);
    len3 = ON_3dVector::Length((ON_3dVector *)&len);
    local_88 = len3 * len3 * len3;
    if (len3 < 2.220446049250313e-16) {
      ns->x = ON_3dVector::ZeroVector.x;
      ns->y = ON_3dVector::ZeroVector.y;
      ns->z = ON_3dVector::ZeroVector.z;
      nt->x = ON_3dVector::ZeroVector.x;
      nt->y = ON_3dVector::ZeroVector.y;
      nt->z = ON_3dVector::ZeroVector.z;
      ds_local._7_1_ = false;
    }
    else {
      ns->x = -ds->z * dst->y + ds->y * dst->z + dss->y * dt->z + -(dss->z * dt->y);
      ns->y = -ds->x * dst->z + ds->z * dst->x + dss->z * dt->x + -(dss->x * dt->z);
      ns->z = -ds->y * dst->x + ds->x * dst->y + dss->x * dt->y + -(dss->y * dt->x);
      nt->x = -ds->z * dtt->y + ds->y * dtt->z + dst->y * dt->z + -(dst->z * dt->y);
      nt->y = -ds->x * dtt->z + ds->z * dtt->x + dst->z * dt->x + -(dst->x * dt->z);
      nt->z = -ds->y * dtt->x + ds->x * dtt->y + dst->x * dt->y + -(dst->y * dt->x);
      ON_3dVector::operator/(&local_b8,ns,len3);
      dVar1 = ON_3dVector::operator*((ON_3dVector *)&len,ns);
      operator*(&local_d0,dVar1 / local_88,(ON_3dVector *)&len);
      ON_3dVector::operator-(&local_a0,&local_b8,&local_d0);
      ns->x = local_a0.x;
      ns->y = local_a0.y;
      ns->z = local_a0.z;
      ON_3dVector::operator/(&local_100,nt,len3);
      dVar1 = ON_3dVector::operator*((ON_3dVector *)&len,nt);
      operator*(&local_118,dVar1 / local_88,(ON_3dVector *)&len);
      ON_3dVector::operator-(&local_e8,&local_100,&local_118);
      nt->x = local_e8.x;
      nt->y = local_e8.y;
      nt->z = local_e8.z;
    }
  }
  else {
    ns->x = ON_3dVector::ZeroVector.x;
    ns->y = ON_3dVector::ZeroVector.y;
    ns->z = ON_3dVector::ZeroVector.z;
    nt->x = ON_3dVector::ZeroVector.x;
    nt->y = ON_3dVector::ZeroVector.y;
    nt->z = ON_3dVector::ZeroVector.z;
  }
  return ds_local._7_1_;
}

Assistant:

bool 
ON_EvNormalPartials(
        const ON_3dVector& ds,
        const ON_3dVector& dt,
        const ON_3dVector& dss,
        const ON_3dVector& dst,
        const ON_3dVector& dtt,
        ON_3dVector& ns,
        ON_3dVector& nt
        )
{
  bool rc = false;
  const double ds_o_ds = ds*ds;
  const double ds_o_dt = ds*dt;
  const double dt_o_dt = dt*dt;

  rc = ON_EvJacobian( ds_o_ds, ds_o_dt, dt_o_dt, nullptr );
  if (!rc) 
  {
    // degenerate Jacobian and unit surface normal is not well defined
    ns = ON_3dVector::ZeroVector;
    nt = ON_3dVector::ZeroVector;
  }
  else 
  {
    // If V: . -> R^3 is nonzero and C^2 and N = V/|V|, then 
    //
    //          V'       V o V'
    //   N' = -----  -  ------- * V.
    //         |V|       |V|^3
    //
    // When a surface has a non-degenerate Jacobian, V = ds X dt
    // and the derivatives of N may be computed from the first
    // and second partials.
    ON_3dVector V = ON_CrossProduct(ds,dt);
    double len = V.Length();
    double len3 = len*len*len;
    if (len < ON_EPSILON)
    {
      ns = ON_3dVector::ZeroVector;
      nt = ON_3dVector::ZeroVector;
      return false;
    }

    ns.x = dss.y*dt.z - dss.z*dt.y + ds.y*dst.z - ds.z*dst.y;
    ns.y = dss.z*dt.x - dss.x*dt.z + ds.z*dst.x - ds.x*dst.z;
    ns.z = dss.x*dt.y - dss.y*dt.x + ds.x*dst.y - ds.y*dst.x;

    nt.x = dst.y*dt.z - dst.z*dt.y + ds.y*dtt.z - ds.z*dtt.y;
    nt.y = dst.z*dt.x - dst.x*dt.z + ds.z*dtt.x - ds.x*dtt.z;
    nt.z = dst.x*dt.y - dst.y*dt.x + ds.x*dtt.y - ds.y*dtt.x;

    ns = ns/len - ((V*ns)/len3)*V;
    nt = nt/len - ((V*nt)/len3)*V;
  }

  return rc;
}